

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::OnStructType
          (BinaryReaderIR *this,Index index,Index field_count,TypeMut *fields)

{
  byte bVar1;
  Module *this_00;
  bool bVar2;
  pointer pSVar3;
  Type *pTVar4;
  reference pvVar5;
  pointer pTVar6;
  unique_ptr<wabt::TypeModuleField,_std::default_delete<wabt::TypeModuleField>_> local_78;
  Type local_6c;
  Type local_64;
  uint local_5c;
  Index i;
  __single_object struct_type;
  undefined1 local_30 [8];
  __single_object field;
  TypeMut *fields_local;
  Index field_count_local;
  Index index_local;
  BinaryReaderIR *this_local;
  
  field._M_t.
  super___uniq_ptr_impl<wabt::TypeModuleField,_std::default_delete<wabt::TypeModuleField>_>._M_t.
  super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>.
  super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl =
       (__uniq_ptr_data<wabt::TypeModuleField,_std::default_delete<wabt::TypeModuleField>,_true,_true>
        )(__uniq_ptr_data<wabt::TypeModuleField,_std::default_delete<wabt::TypeModuleField>,_true,_true>
          )fields;
  GetLocation((Location *)&struct_type,this);
  std::make_unique<wabt::TypeModuleField,wabt::Location>((Location *)local_30);
  std::make_unique<wabt::StructType>();
  pSVar3 = std::unique_ptr<wabt::StructType,_std::default_delete<wabt::StructType>_>::operator->
                     ((unique_ptr<wabt::StructType,_std::default_delete<wabt::StructType>_> *)
                      &stack0xffffffffffffffa8);
  std::vector<wabt::Field,_std::allocator<wabt::Field>_>::resize(&pSVar3->fields,(ulong)field_count)
  ;
  for (local_5c = 0; local_5c < field_count; local_5c = local_5c + 1) {
    pTVar4 = (Type *)((long)field._M_t.
                            super___uniq_ptr_impl<wabt::TypeModuleField,_std::default_delete<wabt::TypeModuleField>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>
                            .super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl +
                     (ulong)local_5c * 0xc);
    pSVar3 = std::unique_ptr<wabt::StructType,_std::default_delete<wabt::StructType>_>::operator->
                       ((unique_ptr<wabt::StructType,_std::default_delete<wabt::StructType>_> *)
                        &stack0xffffffffffffffa8);
    pvVar5 = std::vector<wabt::Field,_std::allocator<wabt::Field>_>::operator[]
                       (&pSVar3->fields,(ulong)local_5c);
    pvVar5->type = *pTVar4;
    bVar1 = *(byte *)((long)field._M_t.
                            super___uniq_ptr_impl<wabt::TypeModuleField,_std::default_delete<wabt::TypeModuleField>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>
                            .super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl +
                      (ulong)local_5c * 0xc + 8);
    pSVar3 = std::unique_ptr<wabt::StructType,_std::default_delete<wabt::StructType>_>::operator->
                       ((unique_ptr<wabt::StructType,_std::default_delete<wabt::StructType>_> *)
                        &stack0xffffffffffffffa8);
    pvVar5 = std::vector<wabt::Field,_std::allocator<wabt::Field>_>::operator[]
                       (&pSVar3->fields,(ulong)local_5c);
    pvVar5->mutable_ = (bool)(bVar1 & 1);
    local_64 = *(Type *)((long)field._M_t.
                               super___uniq_ptr_impl<wabt::TypeModuleField,_std::default_delete<wabt::TypeModuleField>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>
                               .super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl +
                        (ulong)local_5c * 0xc);
    bVar2 = wabt::operator==(local_64,V128);
    (this->module_->features_used).simd = ((this->module_->features_used).simd & 1U) != 0 || bVar2;
    local_6c = *(Type *)((long)field._M_t.
                               super___uniq_ptr_impl<wabt::TypeModuleField,_std::default_delete<wabt::TypeModuleField>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>
                               .super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl +
                        (ulong)local_5c * 0xc);
    bVar2 = wabt::operator==(local_6c,ExnRef);
    (this->module_->features_used).exceptions =
         ((this->module_->features_used).exceptions & 1U) != 0 || bVar2;
  }
  pTVar6 = std::unique_ptr<wabt::TypeModuleField,_std::default_delete<wabt::TypeModuleField>_>::
           operator->((unique_ptr<wabt::TypeModuleField,_std::default_delete<wabt::TypeModuleField>_>
                       *)local_30);
  std::unique_ptr<wabt::TypeEntry,std::default_delete<wabt::TypeEntry>>::operator=
            ((unique_ptr<wabt::TypeEntry,std::default_delete<wabt::TypeEntry>> *)&pTVar6->type,
             (unique_ptr<wabt::StructType,_std::default_delete<wabt::StructType>_> *)
             &stack0xffffffffffffffa8);
  this_00 = this->module_;
  std::unique_ptr<wabt::TypeModuleField,_std::default_delete<wabt::TypeModuleField>_>::unique_ptr
            (&local_78,
             (unique_ptr<wabt::TypeModuleField,_std::default_delete<wabt::TypeModuleField>_> *)
             local_30);
  Module::AppendField(this_00,&local_78);
  std::unique_ptr<wabt::TypeModuleField,_std::default_delete<wabt::TypeModuleField>_>::~unique_ptr
            (&local_78);
  Result::Result((Result *)((long)&this_local + 4),Ok);
  std::unique_ptr<wabt::StructType,_std::default_delete<wabt::StructType>_>::~unique_ptr
            ((unique_ptr<wabt::StructType,_std::default_delete<wabt::StructType>_> *)
             &stack0xffffffffffffffa8);
  std::unique_ptr<wabt::TypeModuleField,_std::default_delete<wabt::TypeModuleField>_>::~unique_ptr
            ((unique_ptr<wabt::TypeModuleField,_std::default_delete<wabt::TypeModuleField>_> *)
             local_30);
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderIR::OnStructType(Index index,
                                    Index field_count,
                                    TypeMut* fields) {
  auto field = std::make_unique<TypeModuleField>(GetLocation());
  auto struct_type = std::make_unique<StructType>();
  struct_type->fields.resize(field_count);
  for (Index i = 0; i < field_count; ++i) {
    struct_type->fields[i].type = fields[i].type;
    struct_type->fields[i].mutable_ = fields[i].mutable_;
    module_->features_used.simd |= (fields[i].type == Type::V128);
    module_->features_used.exceptions |= (fields[i].type == Type::ExnRef);
  }
  field->type = std::move(struct_type);
  module_->AppendField(std::move(field));
  return Result::Ok;
}